

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SliceLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slice(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x15e) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x15e;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    SliceLayerParams::SliceLayerParams(this_00.slice_);
    (this->layer_).slice_ = (SliceLayerParams *)this_00;
  }
  return (SliceLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceLayerParams* NeuralNetworkLayer::mutable_slice() {
  if (!has_slice()) {
    clear_layer();
    set_has_slice();
    layer_.slice_ = new ::CoreML::Specification::SliceLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.slice)
  return layer_.slice_;
}